

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ComputePipeline::recordCommands
          (ComputePipeline *this,OperationContext *context,VkCommandBuffer cmdBuffer,
          VkDescriptorSet descriptorSet)

{
  DeviceInterface *pDVar1;
  Handle<(vk::HandleType)18> *pHVar2;
  Handle<(vk::HandleType)16> *pHVar3;
  Buffer *this_00;
  VkBuffer *pVVar4;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  OperationContext *context_local;
  ComputePipeline *this_local;
  VkDescriptorSet descriptorSet_local;
  
  this_local = (ComputePipeline *)descriptorSet.m_internal;
  pDVar1 = OperationContext::getDeviceInterface(context);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,cmdBuffer,1,pHVar2->m_internal);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (*pDVar1->_vptr_DeviceInterface[0x56])(pDVar1,cmdBuffer,1,pHVar3->m_internal,0,1,&this_local,0,0);
  if (this->m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT) {
    this_00 = de::details::
              UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              ::operator*(&(this->m_indirectBuffer).
                           super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                         );
    pVVar4 = synchronization::Buffer::operator*(this_00);
    (*pDVar1->_vptr_DeviceInterface[0x5e])(pDVar1,cmdBuffer,pVVar4->m_internal,0);
  }
  else {
    (*pDVar1->_vptr_DeviceInterface[0x5d])(pDVar1,cmdBuffer,1,1);
  }
  return;
}

Assistant:

void recordCommands (OperationContext& context, const VkCommandBuffer cmdBuffer, const VkDescriptorSet descriptorSet)
	{
		const DeviceInterface&	vk	= context.getDeviceInterface();

		vk.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipeline);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

		if (m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT)
			vk.cmdDispatchIndirect(cmdBuffer, **m_indirectBuffer, 0u);
		else
			vk.cmdDispatch(cmdBuffer, 1u, 1u, 1u);
	}